

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.hpp
# Opt level: O0

int schema::Schema::countColumns<unsigned_long,std::__cxx11::string,std::__cxx11::string>
              (Column<unsigned_long> *others,
              Column<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *others_1,
              Column<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *others_2)

{
  int pos;
  Column<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff98;
  Column<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *others_00;
  Column<unsigned_long> *in_stack_ffffffffffffffa8;
  function<void_(const_schema::ColumnBase_&)> *in_stack_ffffffffffffffb0;
  int local_1c;
  
  local_1c = 0;
  others_00 = (Column<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&stack0xffffffffffffffc0;
  std::function<void(schema::ColumnBase_const&)>::
  function<schema::Schema::countColumns<unsigned_long,std::__cxx11::string,std::__cxx11::string>(schema::Column<unsigned_long>const&,schema::Column<std::__cxx11::string>const&,schema::Column<std::__cxx11::string>const&)::_lambda(schema::ColumnBase_const&)_1_,void>
            (in_stack_ffffffffffffffb0,(anon_class_8_1_ba1d6db4 *)in_stack_ffffffffffffffa8);
  doForAll<unsigned_long,std::__cxx11::string,std::__cxx11::string>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,others_00,in_stack_ffffffffffffff98
            );
  std::function<void_(const_schema::ColumnBase_&)>::~function
            ((function<void_(const_schema::ColumnBase_&)> *)0x1b240e);
  return local_1c;
}

Assistant:

static int countColumns(const Column<Others>&... others) {
    int pos = 0;

    doForAll(
        [&pos](const ColumnBase& value) {
          value.setPos(pos);
          ++pos;
        },
        others...);

    return pos;
  }